

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

void __thiscall DCorpsePointer::DCorpsePointer(DCorpsePointer *this,AActor *ptr)

{
  uint uVar1;
  uint uVar2;
  DCorpsePointer *pDVar3;
  DCorpsePointer *next;
  DCorpsePointer *first;
  undefined1 local_30 [8];
  TThinkerIterator<DCorpsePointer> iterator;
  AActor *ptr_local;
  DCorpsePointer *this_local;
  
  iterator.super_FThinkerIterator._16_8_ = ptr;
  DThinker::DThinker(&this->super_DThinker,3);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00a03d08;
  TObjPtr<AActor>::TObjPtr(&this->Corpse,(AActor *)iterator.super_FThinkerIterator._16_8_);
  this->Count = 0;
  TThinkerIterator<DCorpsePointer>::TThinkerIterator((TThinkerIterator<DCorpsePointer> *)local_30,3)
  ;
  pDVar3 = TThinkerIterator<DCorpsePointer>::Next
                     ((TThinkerIterator<DCorpsePointer> *)local_30,false);
  next = pDVar3;
  if ((pDVar3 != this) &&
     (uVar1 = pDVar3->Count, uVar2 = FIntCVar::operator_cast_to_int(&sv_corpsequeuesize),
     uVar2 <= uVar1)) {
    next = TThinkerIterator<DCorpsePointer>::Next
                     ((TThinkerIterator<DCorpsePointer> *)local_30,false);
    (*(pDVar3->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  next->Count = next->Count + 1;
  return;
}

Assistant:

DCorpsePointer::DCorpsePointer (AActor *ptr)
: DThinker (STAT_CORPSEPOINTER), Corpse (ptr)
{
	Count = 0;

	// Thinkers are added to the end of their respective lists, so
	// the first thinker in the list is the oldest one.
	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *first = iterator.Next ();

	if (first != this)
	{
		if (first->Count >= (DWORD)sv_corpsequeuesize)
		{
			DCorpsePointer *next = iterator.Next ();
			first->Destroy ();
			first = next;
		}
	}
	++first->Count;
}